

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O2

maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
* __thiscall
pstore::
from_base64<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (maybe<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_void>
           *__return_storage_ptr__,pstore *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                last,
          back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> out)

{
  pstore pVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  array<unsigned_char,_4UL> buff;
  
  uVar4 = 0;
  do {
    iVar3 = (int)uVar4;
    _Var5._M_current = first._M_current;
    if (this == (pstore *)first._M_current) {
LAB_0011e9a0:
      if (iVar3 != 0) {
        if (iVar3 != 4) {
          memset(buff._M_elems + uVar4,0,4 - uVar4);
        }
        last._M_current =
             (char *)details::
                     decode4<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                               (&buff,last._M_current,iVar3 - 1);
      }
      if (_Var5._M_current == first._M_current) {
        __return_storage_ptr__->valid_ = true;
        (__return_storage_ptr__->storage_).__align =
             (anon_struct_8_0_00000001_for___align)last._M_current;
      }
      else {
        *(undefined8 *)__return_storage_ptr__ = 0;
        __return_storage_ptr__->storage_ = (type)0x0;
      }
      return __return_storage_ptr__;
    }
    pVar1 = *this;
    bVar2 = (char)pVar1 + 0xbf;
    if (bVar2 < 0x1a) {
LAB_0011e964:
      buff._M_elems[uVar4] = bVar2;
      uVar4 = (ulong)(iVar3 + 1U);
      if (3 < iVar3 + 1U) {
        last._M_current =
             (char *)details::
                     decode4<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                               (&buff,last._M_current,3);
        uVar4 = 0;
      }
    }
    else {
      if ((byte)((char)pVar1 + 0x9fU) < 0x1a) {
        bVar2 = (char)pVar1 + 0xb9;
        goto LAB_0011e964;
      }
      if ((byte)((char)pVar1 - 0x30U) < 10) {
        bVar2 = (char)pVar1 + 4;
        goto LAB_0011e964;
      }
      if (pVar1 == (pstore)0x2b) {
        bVar2 = 0x3e;
        goto LAB_0011e964;
      }
      if (pVar1 != (pstore)0x3d) {
        _Var5._M_current = (char *)this;
        if (pVar1 == (pstore)0x2f) {
          bVar2 = 0x3f;
          goto LAB_0011e964;
        }
        goto LAB_0011e9a0;
      }
    }
    this = this + 1;
  } while( true );
}

Assistant:

maybe<OutputIterator> from_base64 (InputIterator first, InputIterator last,
                                       OutputIterator out) {
        auto count = 0U;
        std::array<std::uint8_t, 4> buff;

        for (; first != last; ++first) {
            auto c = *first;
            if (c >= 'A' && c <= 'Z') {
                c = c - 'A';
            } else if (c >= 'a' && c <= 'z') {
                c = c - 'a' + 26;
            } else if (c >= '0' && c <= '9') {
                c = c - '0' + 26 * 2;
            } else if (c == '+') {
                c = 0x3E;
            } else if (c == '/') {
                c = 0x3F;
            } else if (c == '=') {
                continue;
            } else {
                break; // error.
            }
            buff[count++] = static_cast<std::uint8_t> (c);
            if (count >= 4U) {
                out = details::decode4 (buff, out, 3);
                count = 0U;
            }
        }
        if (count > 0) {
            std::fill (buff.begin () + count, buff.end (), std::uint8_t{0});
            out = details::decode4 (buff, out, count - 1);
        }
        return first == last ? just (out) : nothing<OutputIterator> ();
    }